

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall
chrono::ChFile_ps::DrawGraphLabel
          (ChFile_ps *this,double dx,double dy,double fontsize,char *label,int dolinesample,
          bool background,double backwidth,ChFile_ps_color bkgndcolor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  double size;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined7 in_register_00000009;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar10;
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  double dVar12;
  undefined1 in_register_00001248 [56];
  undefined1 auVar11 [64];
  undefined1 in_register_00001288 [56];
  undefined1 auVar13 [64];
  double local_c8;
  double local_b8;
  ChVector2<double> local_78;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  ChVector2<double> local_30;
  
  auVar13._8_56_ = in_register_00001288;
  auVar13._0_8_ = fontsize;
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = dy;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = dx;
  auVar2 = vunpcklpd_avx(auVar9._0_16_,auVar11._0_16_);
  local_c8 = auVar2._0_8_ + (this->G_p).m_data[0];
  dVar12 = auVar2._8_8_ + (this->G_p).m_data[1];
  uVar3 = vcmpsd_avx512f(auVar13._0_16_,ZEXT816(0),0);
  bVar4 = (bool)((byte)uVar3 & 1);
  size = (double)((ulong)bVar4 * 0x3fd3333333333333 + (ulong)!bVar4 * (long)fontsize);
  dVar8 = local_c8 + 0.6;
  dVar10 = dVar12 + 0.0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = size;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar7,auVar2);
  GrSave(this);
  ClipToGraph(this);
  SetFont(this,"/Times-Italic",size);
  auVar5._8_8_ = dVar10;
  auVar5._0_8_ = dVar8;
  auVar2 = vpermilpd_avx(auVar5,1);
  if ((int)CONCAT71(in_register_00000009,background) != 0) {
    local_b8 = auVar7._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_b8;
    auVar5 = vfmadd132sd_fma(ZEXT816(0x3fe6666666666666),auVar2,auVar1);
    GrSave(this);
    SetRGB(this,bkgndcolor.r,bkgndcolor.g,bkgndcolor.b);
    auVar6._8_8_ = dVar12;
    auVar6._0_8_ = local_c8;
    local_30.m_data[0] = (double)vmovlpd_avx(auVar6);
    local_40.m_data[0] = backwidth;
    local_40.m_data[1] = size * 1.4;
    local_30.m_data[1] = auVar5._0_8_;
    DrawRectangle(this,&local_30,&local_40,PAGE,true);
    GrRestore(this);
  }
  if (dolinesample != 0) {
    local_78.m_data[1] = dVar10;
    local_78.m_data[0] = dVar8;
    local_50.m_data[0] = local_c8 + 0.08;
    local_50.m_data[1] = (double)vmovhps_avx((undefined1  [16])local_78.m_data);
    DrawLine(this,&local_50,&local_78,PAGE);
    local_c8 = dVar8 + 0.3;
  }
  auVar2 = vfmadd213sd_fma(auVar7,ZEXT816(0) << 0x40,auVar2);
  SetGray(this,0.0);
  local_60.m_data[0] = local_c8;
  local_b8 = auVar2._0_8_;
  local_60.m_data[1] = local_b8;
  DrawText(this,&local_60,label,PAGE,LEFT);
  GrRestore(this);
  return;
}

Assistant:

void ChFile_ps::DrawGraphLabel(double dx,
                               double dy,
                               double fontsize,
                               char* label,
                               int dolinesample,
                               bool background,
                               double backwidth,
                               ChFile_ps_color bkgndcolor) {
    if (fontsize == 0)
        fontsize = 0.3;
    ChVector2<> mp1, mp2, mp3;
    mp3.y() = G_p.y() + dy;
    mp1.y() = mp3.y() + 0.0;
    mp2.y() = mp1.y();
    mp1.x() = G_p.x() + dx;
    mp2.x() = G_p.x() + dx + 0.6;
    ChVector2<> mpa, mpb;
    mpa = mp1;
    mpa.y() -= fontsize * 0.7;
    mpb.x() = backwidth;
    mpb.y() = fontsize * 1.4;

    GrSave();
    ClipToGraph();
    SetFont((char*)"/Times-Italic", fontsize);

    if (background) {
        GrSave();
        SetRGB(bkgndcolor);
        DrawRectangle(mpa, mpb, Space::PAGE, true);
        GrRestore();
    }
    if (dolinesample) {
        mp1.x() += 0.08;
        DrawLine(mp1, mp2, Space::PAGE);
        mp3.x() = mp2.x() + 0.3;
    } else {
        mp3.x() = mp1.x();
    }
    mp3.y() = mp1.y() - fontsize * 0.0;
    SetGray(0.0);
    DrawText(mp3, label, Space::PAGE);

    GrRestore();
}